

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

float ggml_get_f32_nd(ggml_tensor *tensor,int i0,int i1,int i2,int i3)

{
  ggml_type gVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)i3 * tensor->nb[3];
  pvVar2 = tensor->data;
  gVar1 = tensor->type;
  lVar3 = (long)i2 * tensor->nb[2] + (long)i1 * tensor->nb[1] + (long)i0 * tensor->nb[0];
  switch(gVar1) {
  case GGML_TYPE_I8:
    iVar4 = (int)*(char *)((long)pvVar2 + lVar5 + lVar3);
    break;
  case GGML_TYPE_I16:
    iVar4 = (int)*(short *)((long)pvVar2 + lVar5 + lVar3);
    break;
  case GGML_TYPE_I32:
    return (float)*(int *)((long)pvVar2 + lVar5 + lVar3);
  case GGML_TYPE_BF16:
    return (float)((uint)*(ushort *)((long)pvVar2 + lVar5 + lVar3) << 0x10);
  default:
    if (gVar1 == GGML_TYPE_F32) {
      return *(float *)((long)pvVar2 + lVar5 + lVar3);
    }
    if (gVar1 == GGML_TYPE_F16) {
      return *(float *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)pvVar2 + lVar5 + lVar3) * 4);
    }
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x46e,"fatal error");
  }
  return (float)iVar4;
}

Assistant:

float ggml_get_f32_nd(const struct ggml_tensor * tensor, int i0, int i1, int i2, int i3) {
    void * data   = (char *) tensor->data + i0*tensor->nb[0] + i1*tensor->nb[1] + i2*tensor->nb[2] + i3*tensor->nb[3];
    switch (tensor->type) {
        case GGML_TYPE_I8:
            return ((int8_t *) data)[0];
        case GGML_TYPE_I16:
            return ((int16_t *) data)[0];
        case GGML_TYPE_I32:
            return ((int32_t *) data)[0];
        case GGML_TYPE_F16:
            return GGML_FP16_TO_FP32(((ggml_fp16_t *) data)[0]);
        case GGML_TYPE_BF16:
            return GGML_BF16_TO_FP32(((ggml_bf16_t *) data)[0]);
        case GGML_TYPE_F32:
            return ((float *) data)[0];
        default:
            GGML_ABORT("fatal error");
    }
}